

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImGuiStb::stb_textedit_clamp(ImGuiInputTextState *str,STB_TexteditState *state)

{
  int iVar1;
  int *in_RSI;
  ImGuiInputTextState *in_RDI;
  int n;
  
  iVar1 = STB_TEXTEDIT_STRINGLEN(in_RDI);
  if (in_RSI[1] != in_RSI[2]) {
    if (iVar1 < in_RSI[1]) {
      in_RSI[1] = iVar1;
    }
    if (iVar1 < in_RSI[2]) {
      in_RSI[2] = iVar1;
    }
    if (in_RSI[1] == in_RSI[2]) {
      *in_RSI = in_RSI[1];
    }
  }
  if (iVar1 < *in_RSI) {
    *in_RSI = iVar1;
  }
  return;
}

Assistant:

static void stb_textedit_clamp(STB_TEXTEDIT_STRING *str, STB_TexteditState *state)
{
   int n = STB_TEXTEDIT_STRINGLEN(str);
   if (STB_TEXT_HAS_SELECTION(state)) {
      if (state->select_start > n) state->select_start = n;
      if (state->select_end   > n) state->select_end = n;
      // if clamping forced them to be equal, move the cursor to match
      if (state->select_start == state->select_end)
         state->cursor = state->select_start;
   }
   if (state->cursor > n) state->cursor = n;
}